

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_open_memory.c
# Opt level: O0

void test_write_open_memory(void)

{
  undefined1 auVar1 [16];
  archive_entry *paVar2;
  archive_entry *entry;
  size_t blocksize;
  size_t used;
  char *name;
  archive_entry *ae;
  archive *a;
  uint i;
  archive_entry *in_stack_ffffffffffffffa8;
  void *extra;
  int n;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  uint in_stack_ffffffffffffffb4;
  archive *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  wchar_t wVar4;
  archive *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  ulong uVar5;
  archive *in_stack_ffffffffffffffd8;
  char *extra_00;
  void *in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff8;
  uint local_4;
  
  wVar4 = (wchar_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  extra_00 = "/tmp/test";
  paVar2 = archive_entry_new();
  assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,
                   (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
  archive_entry_set_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8);
  archive_entry_set_mode(paVar2,0x8000);
  archive_entry_pathname(in_stack_ffffffffffffffa8);
  extra = (void *)0x0;
  uVar3 = 0;
  assertion_equal_string
            ((char *)in_stack_ffffffffffffffd8,wVar4,(char *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
             (char *)((ulong)in_stack_ffffffffffffffb4 << 0x20),in_stack_fffffffffffffff0,
             in_stack_fffffffffffffff8);
  for (local_4 = 100; local_4 < 0x640; local_4 = local_4 + 1) {
    uVar5 = 0x5e;
    entry = (archive_entry *)archive_write_new();
    assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffb8,
                     (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),extra);
    archive_write_set_format_ustar(in_stack_ffffffffffffffb8);
    assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (longlong)in_stack_ffffffffffffffb8,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)entry,
                        (char *)0x220a81,extra_00);
    archive_write_set_bytes_in_last_block(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (longlong)in_stack_ffffffffffffffb8,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)entry,
                        (char *)0x220abf,extra_00);
    archive_write_set_bytes_per_block(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (longlong)in_stack_ffffffffffffffb8,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)entry,
                        (char *)0x220aff,extra_00);
    buff[local_4] = 0xae;
    archive_write_open_memory
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8
               ,(size_t *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
    paVar2 = entry;
    assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (longlong)in_stack_ffffffffffffffb8,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)entry,
                        (char *)0x220b5b,extra_00);
    in_stack_ffffffffffffffc8 = (archive *)(ulong)local_4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    if (in_stack_ffffffffffffffc8 <
        (archive *)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1ff)) / auVar1,0) * uVar5)) {
      archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),entry);
      assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                          (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (longlong)in_stack_ffffffffffffffb8,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)paVar2,
                          (char *)0x220bc6,extra_00);
    }
    else {
      archive_write_header((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),entry);
      assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                          (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (longlong)in_stack_ffffffffffffffb8,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)paVar2,
                          (char *)0x220c06,extra_00);
    }
    failure("buffer size=%d\n",(ulong)local_4);
    if (local_4 < 0x600) {
      archive_write_close((archive *)0x220c2c);
      assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                          (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (longlong)in_stack_ffffffffffffffb8,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)paVar2,
                          (char *)0x220c5e,extra_00);
    }
    else {
      archive_write_close((archive *)0x220c6d);
      wVar4 = (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      assertion_equal_int((char *)in_stack_ffffffffffffffc8,wVar4,
                          (longlong)in_stack_ffffffffffffffb8,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(longlong)paVar2,
                          (char *)0x220c9c,extra_00);
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffd8;
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffb8;
      archive_filter_bytes
                ((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),(int)((ulong)paVar2 >> 0x20));
      n = 0;
      assertion_equal_int((char *)in_stack_ffffffffffffffc8,wVar4,
                          (longlong)in_stack_ffffffffffffffb8,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),0,(char *)0x220ce6,
                          extra_00);
      in_stack_ffffffffffffffc0 =
           (char *)archive_filter_bytes((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),n);
      archive_filter_bytes((archive *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),n);
      assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                          (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          (longlong)in_stack_ffffffffffffffb8,
                          (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),0,(char *)0x220d37,
                          extra_00);
    }
    archive_write_free((archive *)0x220d41);
    assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (longlong)in_stack_ffffffffffffffb8,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),0,(char *)0x220d6f,
                        extra_00);
    extra = (void *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffffc8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (longlong)in_stack_ffffffffffffffb8,
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),0,(char *)0x220db1,
                        extra_00);
    assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffffb8,
                     (char *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),extra);
  }
  archive_entry_free((archive_entry *)0x220dfc);
  return;
}

Assistant:

DEFINE_TEST(test_write_open_memory)
{
	unsigned int i;
	struct archive *a;
	struct archive_entry *ae;
	const char *name="/tmp/test";

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, name);
	archive_entry_set_mode(ae, S_IFREG);
	assertEqualString(archive_entry_pathname(ae), name);

	/* Try writing with different buffer sizes. */
	/* Make sure that we get failure on too-small buffers, success on
	 * large enough ones. */
	for (i = 100; i < 1600; i++) {
		size_t used;
		size_t blocksize = 94;
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_ustar(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, 1));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		buff[i] = 0xAE;
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, i, &used));
		/* If buffer is smaller than a tar header, this should fail. */
		if (i < (511/blocksize)*blocksize)
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_write_header(a,ae));
		else
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_write_header(a, ae));
		/* If buffer is smaller than a tar header plus 1024 byte
		 * end-of-archive marker, then this should fail. */
		failure("buffer size=%d\n", (int)i);
		if (i < 1536)
			assertEqualIntA(a, ARCHIVE_FATAL,
			    archive_write_close(a));
		else {
			assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
			assertEqualInt(used, archive_filter_bytes(a, -1));
			assertEqualInt(archive_filter_bytes(a, -1),
			    archive_filter_bytes(a, 0));
		}
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		assertEqualInt(buff[i], 0xAE);
		assert(used <= i);
	}
	archive_entry_free(ae);
}